

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGL3DriverBase::setRenderTargetEx
          (COpenGL3DriverBase *this,IRenderTarget *target,u16 clearFlag,SColor clearColor,
          f32 clearDepth,u8 clearStencil)

{
  bool bVar1;
  E_DRIVER_TYPE EVar2;
  E_DRIVER_TYPE EVar3;
  dimension2d<unsigned_int> *pdVar4;
  undefined4 in_ECX;
  undefined2 in_DX;
  COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *in_RSI;
  long *in_RDI;
  undefined1 in_R8B;
  undefined4 in_XMM0_Da;
  double __x;
  COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *in_stack_00000010;
  COpenGL3RenderTarget *renderTarget;
  dimension2d<unsigned_int> destRenderTargetSize;
  undefined4 in_stack_ffffffffffffff88;
  GLuint in_stack_ffffffffffffff8c;
  COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *in_stack_ffffffffffffff90;
  uint local_50 [2];
  dimension2d<unsigned_int> local_48;
  COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *local_40;
  uint local_34 [2];
  dimension2d<unsigned_int> local_2c;
  undefined1 local_21;
  undefined4 local_20;
  undefined2 local_1a;
  COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
  *local_18;
  undefined4 local_8;
  
  local_21 = in_R8B;
  local_20 = in_XMM0_Da;
  local_1a = in_DX;
  local_18 = in_RSI;
  local_8 = in_ECX;
  if (in_RSI != (COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
                 *)0x0) {
    EVar2 = IRenderTarget::getDriverType(&in_RSI->super_IRenderTarget);
    EVar3 = (**(code **)(*in_RDI + 0x2a0))();
    if (EVar2 != EVar3) {
      os::Printer::log((Printer *)
                       "Fatal Error: Tried to set a render target not owned by OpenGL 3 driver.",__x
                      );
      return false;
    }
  }
  local_34[1] = 0;
  local_34[0] = 0;
  core::dimension2d<unsigned_int>::dimension2d(&local_2c,local_34 + 1,local_34);
  if (local_18 ==
      (COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
       *)0x0) {
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::setFBO(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    local_50[1] = 0;
    local_50[0] = 0;
    core::dimension2d<unsigned_int>::dimension2d(&local_48,local_50 + 1,local_50);
    local_2c = local_48;
    (**(code **)(*in_RDI + 0x430))(in_RDI,(int)in_RDI[0x28],*(undefined4 *)((long)in_RDI + 0x144));
  }
  else {
    local_40 = local_18;
    in_stack_ffffffffffffff90 =
         (COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
          *)in_RDI[0xa5];
    COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::getBufferID(local_18);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::setFBO(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::update(in_stack_00000010);
    pdVar4 = COpenGLCoreRenderTarget<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
             ::getSize(local_40);
    local_2c = *pdVar4;
    (**(code **)(*in_RDI + 0x430))(in_RDI,(ulong)local_2c & 0xffffffff,local_2c.Height);
  }
  bVar1 = core::dimension2d<unsigned_int>::operator!=
                    ((dimension2d<unsigned_int> *)in_stack_ffffffffffffff90,
                     (dimension2d<unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar1) {
    *(dimension2d<unsigned_int> *)(in_RDI + 0x14) = local_2c;
    *(undefined1 *)((long)in_RDI + 0x9bc) = 1;
  }
  in_RDI[0x13] = (long)local_18;
  (**(code **)(*in_RDI + 0x2b8))(local_20,in_RDI,local_1a,local_8,local_21);
  return true;
}

Assistant:

bool COpenGL3DriverBase::setRenderTargetEx(IRenderTarget *target, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (target && target->getDriverType() != getDriverType()) {
		os::Printer::log("Fatal Error: Tried to set a render target not owned by OpenGL 3 driver.", ELL_ERROR);
		return false;
	}

	core::dimension2d<u32> destRenderTargetSize(0, 0);

	if (target) {
		COpenGL3RenderTarget *renderTarget = static_cast<COpenGL3RenderTarget *>(target);

		CacheHandler->setFBO(renderTarget->getBufferID());
		renderTarget->update();

		destRenderTargetSize = renderTarget->getSize();

		setViewPortRaw(destRenderTargetSize.Width, destRenderTargetSize.Height);
	} else {
		CacheHandler->setFBO(0);

		destRenderTargetSize = core::dimension2d<u32>(0, 0);

		setViewPortRaw(ScreenSize.Width, ScreenSize.Height);
	}

	if (CurrentRenderTargetSize != destRenderTargetSize) {
		CurrentRenderTargetSize = destRenderTargetSize;

		Transformation3DChanged = true;
	}

	CurrentRenderTarget = target;

	clearBuffers(clearFlag, clearColor, clearDepth, clearStencil);

	return true;
}